

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

void slang::ast::PrimitiveInstanceSymbol::fromSyntax
               (PrimitiveInstantiationSyntax *syntax,ASTContext *context,
               SmallVectorBase<const_slang::ast::Symbol_*> *results,
               SmallVectorBase<const_slang::ast::Symbol_*> *implicitNets)

{
  Token *this;
  ResolvedConfig *pRVar1;
  group_type_pointer pgVar2;
  long lVar3;
  group_type_pointer pgVar4;
  value_type_pointer ppVar5;
  HierarchicalInstanceSyntax *this_00;
  ConfigRule *configRule;
  uint uVar6;
  ushort uVar7;
  byte bVar8;
  bool bVar9;
  string_view sVar10;
  string_view sVar11;
  string_view sVar12;
  size_t sVar13;
  char *pcVar14;
  Symbol *pSVar15;
  bool bVar16;
  int iVar17;
  uint uVar18;
  InstanceBodySymbol *pIVar19;
  PrimitiveSymbol *primitive;
  Scope *pSVar20;
  int *piVar21;
  uint64_t uVar22;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar23;
  ulong uVar24;
  char_pointer puVar25;
  ConfigBlockSymbol *pCVar26;
  char_pointer puVar27;
  ulong uVar28;
  size_type __rlen;
  long lVar29;
  InstanceOverride *this_01;
  ulong uVar30;
  ulong uVar31;
  byte bVar32;
  long lVar33;
  table_element_pointer ppVar34;
  size_type __rlen_1;
  Compilation *this_02;
  value_type_pointer ppVar35;
  value_type_pointer ppVar36;
  char_pointer puVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  uchar uVar43;
  uchar uVar44;
  uchar uVar45;
  uchar uVar46;
  uchar uVar47;
  uchar uVar48;
  uchar uVar49;
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  string_view sVar59;
  iterator iVar60;
  size_t pos;
  size_t pos_1;
  Symbol *sym;
  anon_class_48_6_08dfe5ab createPrims;
  DefinitionLookupResult defResult_1;
  SmallVector<const_slang::ast::Symbol_*,_5UL> parentStack;
  DefinitionLookupResult defResult;
  string_view rootName;
  SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  implicitNetNames;
  value_type_pointer local_308;
  ConfigBlockSymbol *local_2f0;
  pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
  local_2d8;
  ulong local_2b8;
  string_view local_2b0;
  Compilation *local_2a0;
  undefined8 local_298;
  uchar uStack_290;
  uchar uStack_28f;
  uchar uStack_28e;
  uchar uStack_28d;
  uchar uStack_28c;
  uchar uStack_28b;
  uchar uStack_28a;
  uchar uStack_289;
  Compilation *local_288;
  ulong local_280;
  string_view local_278;
  group_type_pointer local_268;
  ConfigRule *local_260;
  InstanceBodySymbol *local_258;
  ulong local_250;
  SourceRange local_248;
  SourceRange local_238;
  SourceRange local_228;
  anon_class_48_6_08dfe5ab local_218;
  DefinitionLookupResult local_1e8;
  undefined1 *local_1d0;
  long local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [40];
  DefinitionLookupResult local_190;
  Symbol local_178;
  uchar local_138;
  uchar uStack_137;
  uchar uStack_136;
  uchar uStack_135;
  uchar uStack_134;
  uchar uStack_133;
  uchar uStack_132;
  uchar uStack_131;
  uchar uStack_130;
  uchar uStack_12f;
  uchar uStack_12e;
  uchar uStack_12d;
  uchar uStack_12c;
  uchar uStack_12b;
  uchar uStack_12a;
  uchar uStack_129;
  uchar local_128;
  uchar uStack_127;
  uchar uStack_126;
  byte bStack_125;
  uchar uStack_124;
  uchar uStack_123;
  uchar uStack_122;
  byte bStack_121;
  uchar uStack_120;
  uchar uStack_11f;
  uchar uStack_11e;
  byte bStack_11d;
  uchar uStack_11c;
  uchar uStack_11b;
  uchar uStack_11a;
  byte bStack_119;
  uchar local_118;
  uchar uStack_117;
  uchar uStack_116;
  byte bStack_115;
  uchar uStack_114;
  uchar uStack_113;
  uchar uStack_112;
  byte bStack_111;
  uchar uStack_110;
  uchar uStack_10f;
  uchar uStack_10e;
  byte bStack_10d;
  uchar uStack_10c;
  uchar uStack_10b;
  uchar uStack_10a;
  byte bStack_109;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  undefined1 local_f8 [144];
  undefined1 local_68 [32];
  undefined1 local_48 [16];
  
  local_68._0_8_ = 0x3f;
  local_68._8_8_ = 1;
  local_68._16_16_ = ZEXT816(0x470b30);
  local_48 = (undefined1  [16])0x0;
  local_2a0 = ((context->scope).ptr)->compilation;
  this = &syntax->type;
  local_f8._128_8_ = (Storage *)local_f8;
  local_f8._136_8_ = (Storage *)local_f8;
  sVar59 = parsing::Token::valueText(this);
  this_02 = local_2a0;
  if (this->kind == Identifier) {
    local_218.comp = local_2a0;
    local_2b0 = sVar59;
    local_218.syntax = syntax;
    local_218.context = context;
    local_218.results = results;
    local_218.implicitNets = implicitNets;
    local_218.implicitNetNames =
         (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
          *)local_f8;
    pIVar19 = Scope::getContainingInstance((context->scope).ptr);
    sVar12._M_str = local_278._M_str;
    sVar12._M_len = local_278._M_len;
    sVar59._M_str = local_278._M_str;
    sVar59._M_len = local_278._M_len;
    if (((pIVar19 != (InstanceBodySymbol *)0x0) &&
        (local_278 = sVar59, pIVar19->parentInstance != (InstanceSymbol *)0x0)) &&
       (pRVar1 = pIVar19->parentInstance->resolvedConfig, local_278 = sVar12,
       pRVar1 != (ResolvedConfig *)0x0)) {
      local_190.definition = &local_178;
      local_190.configRoot = (ConfigBlockSymbol *)0x0;
      local_190.configRule = (ConfigRule *)0x2;
      pCVar26 = pRVar1->useConfig;
      if (pCVar26->resolved == false) {
        ConfigBlockSymbol::resolve(pCVar26);
      }
      if ((pCVar26->instanceOverrides).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
          .size_ctrl.size != 0) {
        pSVar20 = (context->scope).ptr;
        local_1d0 = local_1b8;
        local_1c8 = 0;
        local_1c0 = 5;
        do {
          local_2d8.first.definition = pSVar20->thisSym;
          if ((((InstanceSymbolBase *)
               &((InstanceBodySymbol *)local_2d8.first.definition)->super_Symbol)->super_Symbol).
              kind == InstanceBody) {
            local_2d8.first.definition =
                 (Symbol *)((InstanceBodySymbol *)local_2d8.first.definition)->parentInstance;
          }
          SmallVectorBase<slang::ast::Symbol_const*>::emplace_back<slang::ast::Symbol_const*const&>
                    ((SmallVectorBase<slang::ast::Symbol_const*> *)&local_1d0,(Symbol **)&local_2d8)
          ;
          pSVar20 = (((InstanceSymbolBase *)&(local_2d8.first.definition)->kind)->super_Symbol).
                    parentScope;
        } while ((pSVar20 != (Scope *)0x0) &&
                ((InstanceBodySymbol *)pRVar1->rootInstance !=
                 (InstanceBodySymbol *)local_2d8.first.definition));
        piVar21 = *(int **)(local_1d0 + local_1c8 * 8 + -8);
        if (*piVar21 == 0x2f) {
          piVar21 = *(int **)(*(long *)(piVar21 + 0x14) + 0x90);
        }
        local_108._M_len = *(size_t *)(piVar21 + 2);
        local_108._M_str = *(char **)(piVar21 + 4);
        uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                           ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                            &pCVar26->instanceOverrides,&local_108);
        pcVar14 = local_108._M_str;
        sVar13 = local_108._M_len;
        uVar30 = uVar22 >> ((byte)(pCVar26->instanceOverrides).table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                  .arrays.groups_size_index & 0x3f);
        pgVar2 = (pCVar26->instanceOverrides).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                 .arrays.groups_;
        lVar29 = (uVar22 & 0xff) * 4;
        uVar43 = (&UNK_0047072c)[lVar29];
        uVar44 = (&UNK_0047072d)[lVar29];
        uVar45 = (&UNK_0047072e)[lVar29];
        bVar8 = (&UNK_0047072f)[lVar29];
        uVar28 = 0;
LAB_001f5fe5:
        pgVar4 = pgVar2 + uVar30;
        local_118 = pgVar4->m[0].n;
        uStack_117 = pgVar4->m[1].n;
        uStack_116 = pgVar4->m[2].n;
        bStack_115 = pgVar4->m[3].n;
        uStack_114 = pgVar4->m[4].n;
        uStack_113 = pgVar4->m[5].n;
        uStack_112 = pgVar4->m[6].n;
        bStack_111 = pgVar4->m[7].n;
        uStack_110 = pgVar4->m[8].n;
        uStack_10f = pgVar4->m[9].n;
        uStack_10e = pgVar4->m[10].n;
        bStack_10d = pgVar4->m[0xb].n;
        uStack_10c = pgVar4->m[0xc].n;
        uStack_10b = pgVar4->m[0xd].n;
        uStack_10a = pgVar4->m[0xe].n;
        bVar32 = pgVar4->m[0xf].n;
        auVar38[0] = -(local_118 == uVar43);
        auVar38[1] = -(uStack_117 == uVar44);
        auVar38[2] = -(uStack_116 == uVar45);
        auVar38[3] = -(bStack_115 == bVar8);
        auVar38[4] = -(uStack_114 == uVar43);
        auVar38[5] = -(uStack_113 == uVar44);
        auVar38[6] = -(uStack_112 == uVar45);
        auVar38[7] = -(bStack_111 == bVar8);
        auVar38[8] = -(uStack_110 == uVar43);
        auVar38[9] = -(uStack_10f == uVar44);
        auVar38[10] = -(uStack_10e == uVar45);
        auVar38[0xb] = -(bStack_10d == bVar8);
        auVar38[0xc] = -(uStack_10c == uVar43);
        auVar38[0xd] = -(uStack_10b == uVar44);
        auVar38[0xe] = -(uStack_10a == uVar45);
        auVar38[0xf] = -(bVar32 == bVar8);
        uVar18 = (uint)(ushort)((ushort)(SUB161(auVar38 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar38 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar38 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar38 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar38 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar38 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar38 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar38 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar38 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar38 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar38 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar38 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar38 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar38 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar38 >> 0x77,0) & 1) << 0xe);
        uVar31 = uVar28;
        bStack_109 = bVar32;
        if (uVar18 == 0) {
LAB_001f60a1:
          sVar10._M_str = local_278._M_str;
          sVar10._M_len = local_278._M_len;
          if (((&boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::
                 is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7] & bVar32) != 0)
          goto code_r0x001f60c6;
        }
        else {
          ppVar36 = (pCVar26->instanceOverrides).table_.
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                    .arrays.elements_;
          local_298 = uVar28;
LAB_001f604c:
          uVar6 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          uVar28 = (ulong)uVar6;
          if ((sVar13 != ppVar36[uVar30 * 0xf + uVar28].first._M_len) ||
             ((sVar13 != 0 &&
              (iVar17 = bcmp(pcVar14,ppVar36[uVar30 * 0xf + uVar28].first._M_str,sVar13),
              iVar17 != 0)))) goto LAB_001f6087;
          lVar29 = local_1c8;
          ppVar36 = ppVar36 + uVar30 * 0xf + uVar28;
LAB_001f60fc:
          ppVar35 = ppVar36;
          this_01 = &ppVar35->second;
          lVar33 = lVar29 + -1;
          if (lVar33 == 0) {
            if (((ppVar35->second).childNodes.table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                 .size_ctrl.size == 0) ||
               (uVar28 = (syntax->instances).elements._M_extent._M_extent_value + 1, uVar28 < 2))
            goto LAB_001f6283;
            local_288 = ((context->scope).ptr)->compilation;
            uVar30 = 0;
            bVar16 = false;
            do {
              ppSVar23 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                                   ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                     *)((syntax->instances).elements._M_ptr + uVar30 * 2));
              this_00 = (HierarchicalInstanceSyntax *)*ppSVar23;
              if (this_00->decl == (InstanceNameSyntax *)0x0) {
                sVar59 = (string_view)(ZEXT816(0x477dec) << 0x40);
              }
              else {
                sVar59 = parsing::Token::valueText(&this_00->decl->name);
              }
              local_278 = sVar59;
              uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                                 ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>
                                   *)this_01,&local_278);
              pcVar14 = local_278._M_str;
              sVar13 = local_278._M_len;
              uVar31 = uVar22 >> ((byte)(this_01->childNodes).table_.
                                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                        .arrays.groups_size_index & 0x3f);
              local_268 = (ppVar35->second).childNodes.table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                          .arrays.groups_;
              lVar29 = (uVar22 & 0xff) * 4;
              uVar43 = (&UNK_0047072c)[lVar29];
              uVar44 = (&UNK_0047072d)[lVar29];
              uVar45 = (&UNK_0047072e)[lVar29];
              uVar46 = (&UNK_0047072f)[lVar29];
              local_250 = (ulong)((uint)uVar22 & 7);
              local_280 = 0;
              uVar47 = uVar43;
              uVar48 = uVar44;
              uVar49 = uVar45;
              uVar50 = uVar46;
              uVar51 = uVar43;
              uVar52 = uVar44;
              uVar53 = uVar45;
              uVar54 = uVar46;
              uVar55 = uVar43;
              uVar56 = uVar44;
              uVar57 = uVar45;
              uVar58 = uVar46;
              do {
                pgVar2 = local_268 + uVar31;
                local_138 = pgVar2->m[0].n;
                uStack_137 = pgVar2->m[1].n;
                uStack_136 = pgVar2->m[2].n;
                uStack_135 = pgVar2->m[3].n;
                uStack_134 = pgVar2->m[4].n;
                uStack_133 = pgVar2->m[5].n;
                uStack_132 = pgVar2->m[6].n;
                uStack_131 = pgVar2->m[7].n;
                uStack_130 = pgVar2->m[8].n;
                uStack_12f = pgVar2->m[9].n;
                uStack_12e = pgVar2->m[10].n;
                uStack_12d = pgVar2->m[0xb].n;
                uStack_12c = pgVar2->m[0xc].n;
                uStack_12b = pgVar2->m[0xd].n;
                uStack_12a = pgVar2->m[0xe].n;
                uStack_129 = pgVar2->m[0xf].n;
                auVar40[0] = -(local_138 == uVar43);
                auVar40[1] = -(uStack_137 == uVar44);
                auVar40[2] = -(uStack_136 == uVar45);
                auVar40[3] = -(uStack_135 == uVar46);
                auVar40[4] = -(uStack_134 == uVar47);
                auVar40[5] = -(uStack_133 == uVar48);
                auVar40[6] = -(uStack_132 == uVar49);
                auVar40[7] = -(uStack_131 == uVar50);
                auVar40[8] = -(uStack_130 == uVar51);
                auVar40[9] = -(uStack_12f == uVar52);
                auVar40[10] = -(uStack_12e == uVar53);
                auVar40[0xb] = -(uStack_12d == uVar54);
                auVar40[0xc] = -(uStack_12c == uVar55);
                auVar40[0xd] = -(uStack_12b == uVar56);
                auVar40[0xe] = -(uStack_12a == uVar57);
                auVar40[0xf] = -(uStack_129 == uVar58);
                local_2b8 = CONCAT71(local_2b8._1_7_,uStack_129);
                uVar18 = (uint)(ushort)((ushort)(SUB161(auVar40 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar40 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar40 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar40 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar40 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar40 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar40 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar40 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar40 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar40 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar40 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar40 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar40 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar40 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar40 >> 0x77,0) & 1) << 0xe);
                if (uVar18 != 0) {
                  local_308 = (ppVar35->second).childNodes.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                              .arrays.elements_;
                  local_298 = CONCAT17(uVar50,CONCAT16(uVar49,CONCAT15(uVar48,CONCAT14(uVar47,
                                                  CONCAT13(uVar46,CONCAT12(uVar45,CONCAT11(uVar44,
                                                  uVar43)))))));
                  uStack_290 = uVar51;
                  uStack_28f = uVar52;
                  uStack_28e = uVar53;
                  uStack_28d = uVar54;
                  uStack_28c = uVar55;
                  uStack_28b = uVar56;
                  uStack_28a = uVar57;
                  uStack_289 = uVar58;
                  do {
                    uVar6 = 0;
                    if (uVar18 != 0) {
                      for (; (uVar18 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                      }
                    }
                    uVar24 = (ulong)uVar6;
                    if (sVar13 == local_308[uVar31 * 0xf + uVar24].first._M_len) {
                      if (sVar13 != 0) {
                        iVar17 = bcmp(pcVar14,local_308[uVar31 * 0xf + uVar24].first._M_str,sVar13);
                        if (iVar17 != 0) goto LAB_001f642b;
                      }
                      local_308 = local_308 + uVar31 * 0xf + uVar24;
                      configRule = (local_308->second).rule;
                      if (configRule == (ConfigRule *)0x0) {
                        bVar9 = true;
                        goto LAB_001f6593;
                      }
                      pSVar20 = (context->scope).ptr;
                      local_228 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)this_00);
                      Compilation::getDefinition
                                (&local_1e8,local_288,local_2b0,pSVar20,configRule,local_228,
                                 (DiagCode)0xd10006);
                      local_2d8.first.configRule = local_1e8.configRule;
                      local_2d8.first.definition = local_1e8.definition;
                      local_2d8.first.configRoot = local_1e8.configRoot;
                      local_2d8.second = this_00;
                      SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                      ::
                      emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                                ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                                  *)&local_190,&local_2d8);
                      pCVar26 = local_1e8.configRoot;
                      if (local_1e8.configRoot == (ConfigBlockSymbol *)0x0) goto LAB_001f6786;
                      goto LAB_001f669f;
                    }
LAB_001f642b:
                    uVar18 = uVar18 - 1 & uVar18;
                    uVar43 = (uchar)local_298;
                    uVar44 = local_298._1_1_;
                    uVar45 = local_298._2_1_;
                    uVar46 = local_298._3_1_;
                    uVar47 = local_298._4_1_;
                    uVar48 = local_298._5_1_;
                    uVar49 = local_298._6_1_;
                    uVar50 = local_298._7_1_;
                    uVar51 = uStack_290;
                    uVar52 = uStack_28f;
                    uVar53 = uStack_28e;
                    uVar54 = uStack_28d;
                    uVar55 = uStack_28c;
                    uVar56 = uStack_28b;
                    uVar57 = uStack_28a;
                    uVar58 = uStack_289;
                  } while (uVar18 != 0);
                }
                if (((&boost::unordered::detail::foa::
                       group15<boost::unordered::detail::foa::plain_integral>::
                       is_not_overflowed(unsigned_long)::shift)[local_250] & (byte)local_2b8) == 0)
                break;
                uVar24 = (ppVar35->second).childNodes.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                         .arrays.groups_size_mask;
                lVar29 = uVar31 + local_280;
                local_280 = local_280 + 1;
                uVar31 = lVar29 + 1U & uVar24;
              } while (local_280 <= uVar24);
              bVar9 = false;
              local_308 = (value_type_pointer)0x0;
LAB_001f6593:
              if (!bVar16) {
                pSVar20 = (context->scope).ptr;
                local_238 = parsing::Token::range(this);
                Compilation::getDefinition
                          (&local_2d8.first,local_288,local_2b0,pSVar20,local_238,(DiagCode)0xd10006
                          );
                local_258 = (InstanceBodySymbol *)local_2d8.first.definition;
                local_260 = local_2d8.first.configRule;
                local_2f0 = local_2d8.first.configRoot;
              }
              local_2d8.first.definition = &local_258->super_Symbol;
              local_2d8.first.configRule = local_260;
              local_2d8.first.configRoot = local_2f0;
              local_2d8.second = this_00;
              SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
              ::
              emplace_back<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                        ((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,slang::syntax::HierarchicalInstanceSyntax_const*>>
                          *)&local_190,&local_2d8);
              bVar16 = true;
              if (local_2f0 == (ConfigBlockSymbol *)0x0) {
                local_2f0 = (ConfigBlockSymbol *)0x0;
              }
              else {
                pCVar26 = local_2f0;
                if (!bVar9) goto LAB_001f6786;
LAB_001f669f:
                iVar60 = boost::unordered::detail::foa::
                         table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                         ::begin((table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                  *)&local_308->second);
                if (iVar60.p_ != (table_element_pointer)0x0) {
LAB_001f66c6:
                  anon_unknown.dwarf_5d3f84::checkForInvalidNestedConfigNodes
                            (context,&(iVar60.p_)->second,pCVar26);
                  puVar27 = iVar60.pc_ + 0x12;
                  puVar37 = iVar60.pc_ + 2;
LAB_001f66e6:
                  puVar25 = puVar37;
                  puVar37 = iVar60.pc_;
                  ppVar34 = iVar60.p_ + 1;
                  if (((uint)iVar60.pc_ & 0xf) != 0xe) goto code_r0x001f66f5;
                  auVar41[0] = -(*puVar25 == '\0');
                  auVar41[1] = -(puVar25[1] == '\0');
                  auVar41[2] = -(puVar25[2] == '\0');
                  auVar41[3] = -(puVar25[3] == '\0');
                  auVar41[4] = -(puVar25[4] == '\0');
                  auVar41[5] = -(puVar25[5] == '\0');
                  auVar41[6] = -(puVar25[6] == '\0');
                  auVar41[7] = -(puVar25[7] == '\0');
                  auVar41[8] = -(puVar25[8] == '\0');
                  auVar41[9] = -(puVar25[9] == '\0');
                  auVar41[10] = -(puVar25[10] == '\0');
                  auVar41[0xb] = -(puVar25[0xb] == '\0');
                  auVar41[0xc] = -(puVar25[0xc] == '\0');
                  auVar41[0xd] = -(puVar25[0xd] == '\0');
                  auVar41[0xe] = -(puVar25[0xe] == '\0');
                  auVar41[0xf] = -(puVar25[0xf] == '\0');
                  uVar7 = (ushort)(SUB161(auVar41 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar41 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar41 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar41 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar41 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar41 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar41 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar41 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar41 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar41 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar41 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar41 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar41 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar41 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar41 >> 0x77,0) & 1) << 0xe;
                  while (uVar7 == 0x7fff) {
                    ppVar34 = ppVar34 + 0xf;
                    auVar42[0] = -(*puVar27 == '\0');
                    auVar42[1] = -(puVar27[1] == '\0');
                    auVar42[2] = -(puVar27[2] == '\0');
                    auVar42[3] = -(puVar27[3] == '\0');
                    auVar42[4] = -(puVar27[4] == '\0');
                    auVar42[5] = -(puVar27[5] == '\0');
                    auVar42[6] = -(puVar27[6] == '\0');
                    auVar42[7] = -(puVar27[7] == '\0');
                    auVar42[8] = -(puVar27[8] == '\0');
                    auVar42[9] = -(puVar27[9] == '\0');
                    auVar42[10] = -(puVar27[10] == '\0');
                    auVar42[0xb] = -(puVar27[0xb] == '\0');
                    auVar42[0xc] = -(puVar27[0xc] == '\0');
                    auVar42[0xd] = -(puVar27[0xd] == '\0');
                    auVar42[0xe] = -(puVar27[0xe] == '\0');
                    auVar42[0xf] = -(puVar27[0xf] == '\0');
                    puVar25 = puVar27;
                    puVar27 = puVar27 + 0x10;
                    uVar7 = (ushort)(SUB161(auVar42 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe;
                  }
                  uVar18 = 0;
                  if ((uVar7 ^ 0x7fff) != 0) {
                    for (; ((uVar7 ^ 0x7fff) >> uVar18 & 1) == 0; uVar18 = uVar18 + 1) {
                    }
                  }
                  if (puVar25[uVar18] != '\x01') {
                    puVar25 = puVar25 + uVar18;
                    ppVar34 = ppVar34 + uVar18;
                    goto LAB_001f6713;
                  }
                }
              }
LAB_001f6786:
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar28 >> 1);
          }
          else {
            lVar3 = *(long *)(local_1d0 + lVar29 * 8 + -0x10);
            uVar22 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )this_01,(basic_string_view<char,_std::char_traits<char>_> *)
                                         (lVar3 + 8));
            uVar30 = uVar22 >> ((byte)(ppVar35->second).childNodes.table_.
                                      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                      .arrays.groups_size_index & 0x3f);
            lVar29 = (uVar22 & 0xff) * 4;
            uVar43 = (&UNK_0047072c)[lVar29];
            uVar44 = (&UNK_0047072d)[lVar29];
            uVar45 = (&UNK_0047072e)[lVar29];
            bVar8 = (&UNK_0047072f)[lVar29];
            uVar28 = (ulong)((uint)uVar22 & 7);
            uVar31 = 0;
            while( true ) {
              pgVar4 = (ppVar35->second).childNodes.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                       .arrays.groups_;
              pgVar2 = pgVar4 + uVar30;
              local_128 = pgVar2->m[0].n;
              uStack_127 = pgVar2->m[1].n;
              uStack_126 = pgVar2->m[2].n;
              bStack_125 = pgVar2->m[3].n;
              uStack_124 = pgVar2->m[4].n;
              uStack_123 = pgVar2->m[5].n;
              uStack_122 = pgVar2->m[6].n;
              bStack_121 = pgVar2->m[7].n;
              uStack_120 = pgVar2->m[8].n;
              uStack_11f = pgVar2->m[9].n;
              uStack_11e = pgVar2->m[10].n;
              bStack_11d = pgVar2->m[0xb].n;
              uStack_11c = pgVar2->m[0xc].n;
              uStack_11b = pgVar2->m[0xd].n;
              uStack_11a = pgVar2->m[0xe].n;
              bVar32 = pgVar2->m[0xf].n;
              auVar39[0] = -(local_128 == uVar43);
              auVar39[1] = -(uStack_127 == uVar44);
              auVar39[2] = -(uStack_126 == uVar45);
              auVar39[3] = -(bStack_125 == bVar8);
              auVar39[4] = -(uStack_124 == uVar43);
              auVar39[5] = -(uStack_123 == uVar44);
              auVar39[6] = -(uStack_122 == uVar45);
              auVar39[7] = -(bStack_121 == bVar8);
              auVar39[8] = -(uStack_120 == uVar43);
              auVar39[9] = -(uStack_11f == uVar44);
              auVar39[10] = -(uStack_11e == uVar45);
              auVar39[0xb] = -(bStack_11d == bVar8);
              auVar39[0xc] = -(uStack_11c == uVar43);
              auVar39[0xd] = -(uStack_11b == uVar44);
              auVar39[0xe] = -(uStack_11a == uVar45);
              auVar39[0xf] = -(bVar32 == bVar8);
              uVar18 = (uint)(ushort)((ushort)(SUB161(auVar39 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar39 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar39 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar39 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar39 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar39 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar39 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar39 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar39 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar39 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar39 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar39 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar39 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar39 >> 0x6f,0) & 1) << 0xd |
                                     (ushort)(SUB161(auVar39 >> 0x77,0) & 1) << 0xe);
              bStack_119 = bVar32;
              if (uVar18 != 0) {
                ppVar5 = (ppVar35->second).childNodes.table_.
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                         .arrays.elements_;
                local_2b8 = uVar28;
                do {
                  local_298 = (ulong)uVar18;
                  uVar6 = 0;
                  if (uVar18 != 0) {
                    for (; (uVar18 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
                    }
                  }
                  ppVar36 = ppVar5 + uVar30 * 0xf + (ulong)uVar6;
                  bVar16 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                           operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                       *)this_01,
                                      (basic_string_view<char,_std::char_traits<char>_> *)
                                      (lVar3 + 8),&ppVar36->first);
                  lVar29 = lVar33;
                  if (bVar16) goto LAB_001f60fc;
                  uVar18 = (uint)local_298 - 1 & (uint)local_298;
                } while (uVar18 != 0);
                bVar32 = pgVar4[uVar30].m[0xf].n;
                uVar28 = local_2b8;
              }
              sVar11._M_str = local_278._M_str;
              sVar11._M_len = local_278._M_len;
              if (((&boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::
                     is_not_overflowed(unsigned_long)::shift)[uVar28] & bVar32) == 0) break;
              uVar24 = (ppVar35->second).childNodes.table_.
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                       .arrays.groups_size_mask;
              lVar29 = uVar30 + uVar31;
              uVar31 = uVar31 + 1;
              uVar30 = lVar29 + 1U & uVar24;
              local_278 = sVar11;
              if (uVar24 < uVar31) break;
            }
          }
        }
        goto LAB_001f6283;
      }
LAB_001f5d9b:
      pSVar15 = local_190.definition;
      if (local_190.configRoot != (ConfigBlockSymbol *)0x0) {
        lVar29 = (long)local_190.configRoot << 5;
        lVar33 = 0;
        do {
          fromSyntax::anon_class_48_6_08dfe5ab::operator()
                    (&local_218,*(DefinitionLookupResult **)((long)&pSVar15->kind + lVar33),
                     *(HierarchicalInstanceSyntax **)((long)&(pSVar15->name)._M_str + lVar33));
          lVar33 = lVar33 + 0x20;
        } while (lVar29 != lVar33);
        if (local_190.definition != &local_178) {
          operator_delete(local_190.definition);
        }
        goto LAB_001f5eae;
      }
      this_02 = local_2a0;
      if (local_190.definition != &local_178) {
        operator_delete(local_190.definition);
        this_02 = local_2a0;
      }
    }
    pSVar20 = (context->scope).ptr;
    local_248 = parsing::Token::range(this);
    Compilation::getDefinition(&local_190,this_02,local_2b0,pSVar20,local_248,(DiagCode)0xd10006);
    fromSyntax::anon_class_48_6_08dfe5ab::operator()
              (&local_218,(DefinitionLookupResult *)local_190.definition,
               (HierarchicalInstanceSyntax *)local_190.configRule);
  }
  else {
    primitive = Compilation::getGateType(local_2a0,sVar59);
    anon_unknown_287::createPrimitives<slang::syntax::PrimitiveInstantiationSyntax>
              (primitive,syntax,(HierarchicalInstanceSyntax *)0x0,context,results,implicitNets,
               (SmallSet<std::basic_string_view<char,_std::char_traits<char>_>,_8UL,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
                *)local_f8);
  }
LAB_001f5eae:
  boost::unordered::detail::foa::
  table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
  ::delete_((allocator_type)local_f8._136_8_,
            (table_arrays<std::basic_string_view<char,_std::char_traits<char>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_slang::detail::hashing::StackAllocator<std::basic_string_view<char,_std::char_traits<char>_>,_128UL,_16UL>_>
             *)local_68);
  return;
LAB_001f6087:
  uVar18 = uVar18 - 1 & uVar18;
  uVar31 = local_298;
  if (uVar18 == 0) goto LAB_001f60a1;
  goto LAB_001f604c;
code_r0x001f60c6:
  uVar24 = (pCVar26->instanceOverrides).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
           .arrays.groups_size_mask;
  uVar28 = uVar31 + 1;
  uVar30 = uVar30 + uVar31 + 1 & uVar24;
  local_278 = sVar10;
  if (uVar24 < uVar28) {
LAB_001f6283:
    if (local_1d0 != local_1b8) {
      operator_delete(local_1d0);
    }
    goto LAB_001f5d9b;
  }
  goto LAB_001f5fe5;
code_r0x001f66f5:
  iVar60.p_ = ppVar34;
  iVar60.pc_ = puVar37 + 1;
  puVar27 = puVar27 + 1;
  puVar37 = puVar25 + 1;
  if (puVar25[-1] != '\0') goto code_r0x001f6706;
  goto LAB_001f66e6;
code_r0x001f6706:
  if (puVar25[-1] == '\x01') goto LAB_001f6786;
  puVar25 = puVar25 + -1;
LAB_001f6713:
  iVar60.p_ = ppVar34;
  iVar60.pc_ = puVar25;
  goto LAB_001f66c6;
}

Assistant:

void PrimitiveInstanceSymbol::fromSyntax(const PrimitiveInstantiationSyntax& syntax,
                                         const ASTContext& context,
                                         SmallVectorBase<const Symbol*>& results,
                                         SmallVectorBase<const Symbol*>& implicitNets) {
    SmallSet<std::string_view, 8> implicitNetNames;
    auto& comp = context.getCompilation();
    auto name = syntax.type.valueText();

    // If the type is not an identifier then it should be a gate keyword.
    if (syntax.type.kind != TokenKind::Identifier) {
        auto prim = comp.getGateType(name);
        SLANG_ASSERT(prim);
        createPrimitives(*prim, syntax, nullptr, context, results, implicitNets, implicitNetNames);
        return;
    }

    auto createPrims = [&](const Compilation::DefinitionLookupResult& defResult,
                           const HierarchicalInstanceSyntax* specificInstance) {
        if (defResult.configRule)
            defResult.configRule->isUsed = true;

        auto def = defResult.definition;
        if (def) {
            if (def->kind == SymbolKind::Primitive) {
                createPrimitives(def->as<PrimitiveSymbol>(), syntax, specificInstance, context,
                                 results, implicitNets, implicitNetNames);
                return;
            }

            SLANG_ASSERT(syntax.strength || syntax.delay);
            if (syntax.strength) {
                auto& diag = context.addDiag(diag::InstanceWithStrength,
                                             syntax.strength->sourceRange());
                diag << def->name;
                if (specificInstance)
                    diag << specificInstance->sourceRange();
            }
            else if (comp.hasFlag(CompilationFlags::AllowBareValParamAssignment) &&
                     syntax.delay->kind == SyntaxKind::DelayControl) {
                // We're allowing this to be a hierarchical instantiation with a single param
                // assignment, and just pretending the parentheses were provided.
                auto& delaySyntax = syntax.delay->as<DelaySyntax>();
                auto& delayVal = *delaySyntax.delayValue;

                SmallVector<TokenOrSyntax> parameters;
                parameters.push_back(comp.emplace<OrderedParamAssignmentSyntax>(delayVal));

                auto missing = [&](TokenKind tk, SourceLocation loc) {
                    return Token::createMissing(comp, tk, loc);
                };

                auto pvas = comp.emplace<ParameterValueAssignmentSyntax>(
                    delaySyntax.hash,
                    missing(TokenKind::OpenParenthesis, delayVal.getFirstToken().location()),
                    parameters.copy(comp),
                    missing(TokenKind::CloseParenthesis, delayVal.getLastToken().location()));

                // Rebuild the instance list. The const_casts are fine because
                // we're going to immediately treat them as const again below.
                SmallVector<TokenOrSyntax> instanceBuf;
                if (specificInstance) {
                    instanceBuf.push_back(
                        const_cast<HierarchicalInstanceSyntax*>(specificInstance));
                }
                else {
                    for (auto inst : syntax.instances)
                        instanceBuf.push_back(const_cast<HierarchicalInstanceSyntax*>(inst));
                }

                auto instantiation = comp.emplace<HierarchyInstantiationSyntax>(
                    syntax.attributes, syntax.type, pvas, instanceBuf.copy(comp), syntax.semi);
                InstanceSymbol::fromSyntax(comp, *instantiation, context, results, implicitNets);
                return;
            }
            else {
                auto& diag = context.addDiag(diag::InstanceWithDelay,
                                             syntax.delay->getFirstToken().location() + 1);
                if (specificInstance)
                    diag << specificInstance->sourceRange();
            }
        }
        UninstantiatedDefSymbol::fromSyntax(comp, syntax, specificInstance, context, results,
                                            implicitNets, implicitNetNames);
    };

    // Check if there are configuration instance override paths to check.
    auto parentInst = context.scope->getContainingInstance();
    if (parentInst && parentInst->parentInstance && parentInst->parentInstance->resolvedConfig) {
        ResolvedInstanceRules instanceRules;
        resolveInstanceOverrides(*parentInst->parentInstance->resolvedConfig, context, syntax, name,
                                 diag::UnknownPrimitive, instanceRules);
        if (!instanceRules.empty()) {
            for (auto& [defResult, instSyntax] : instanceRules)
                createPrims(defResult, instSyntax);
            return;
        }
    }

    // Simple case; just create the primitive instances.
    auto defResult = comp.getDefinition(name, *context.scope, syntax.type.range(),
                                        diag::UnknownPrimitive);
    createPrims(defResult, nullptr);
}